

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

void capnp::writeMessageToFd(int fd,ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  size_t in_RCX;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  undefined1 local_30 [8];
  FdOutputStream stream;
  int fd_local;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_local;
  
  segments_00.ptr = (ArrayPtr<const_capnp::word> *)segments.size_;
  stream.autoclose.fd = fd;
  kj::FdOutputStream::FdOutputStream((FdOutputStream *)local_30,fd);
  segments_00.size_ = in_RCX;
  writeMessage((capnp *)local_30,(OutputStream *)segments.ptr,segments_00);
  kj::FdOutputStream::~FdOutputStream((FdOutputStream *)local_30);
  return;
}

Assistant:

void writeMessageToFd(int fd, kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
#ifdef _WIN32
    auto oldMode = _setmode(fd, _O_BINARY);
    if (oldMode != _O_BINARY) {
      _setmode(fd, oldMode);
      KJ_FAIL_REQUIRE("Tried to write a message to a file descriptor that is in text mode. Set the "
          "file descriptor to binary mode by calling the _setmode Windows CRT function, or passing "
          "_O_BINARY to _open().");
    }
#endif
  kj::FdOutputStream stream(fd);
  writeMessage(stream, segments);
}